

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Tokens * __thiscall lexer::Lexer::analize(Tokens *__return_storage_ptr__,Lexer *this,string *string)

{
  bool bVar1;
  reference pcVar2;
  reference this_00;
  reference pvVar3;
  LexerError *this_01;
  Token local_f0;
  undefined1 local_b1;
  string local_b0;
  undefined8 local_7c;
  Transition transition;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  const_iterator c;
  int prevColumn;
  int prevLine;
  int column;
  int line;
  string token;
  RuleId currentState;
  string *string_local;
  Lexer *this_local;
  Tokens *tokens;
  
  token.field_2._12_4_ = 0;
  token.field_2._M_local_buf[0xb] = '\0';
  std::vector<lexer::Token,_std::allocator<lexer::Token>_>::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&column);
  prevLine = 1;
  prevColumn = 0;
  c._M_current._4_4_ = 1;
  c._M_current._0_4_ = 0;
  local_60._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    transition._12_8_ = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      (&local_60,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&transition.increment);
    if (!bVar1) {
      token.field_2._M_local_buf[0xb] = '\x01';
      std::__cxx11::string::~string((string *)&column);
      if ((token.field_2._M_local_buf[0xb] & 1U) == 0) {
        std::vector<lexer::Token,_std::allocator<lexer::Token>_>::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_60);
    if (*pcVar2 == '\n') {
      prevLine = prevLine + 1;
      prevColumn = 0;
    }
    else {
      prevColumn = prevColumn + 1;
    }
    this_00 = std::
              vector<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
              ::at(&this->lexerStateMachine,(long)(int)token.field_2._12_4_);
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_60);
    pvVar3 = std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>::at
                       (this_00,(long)*pcVar2);
    local_7c._0_4_ = pvVar3->ruleId;
    local_7c._4_4_ = pvVar3->tokenId;
    transition.ruleId._0_1_ = pvVar3->putChar;
    transition.ruleId._1_3_ = *(undefined3 *)&pvVar3->field_0x9;
    transition.tokenId = pvVar3->increment;
    transition.putChar = pvVar3->lookInSymbolTable;
    transition._9_3_ = *(undefined3 *)&pvVar3->field_0x11;
    if ((transition._0_8_ & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_60);
      std::__cxx11::string::push_back((char)&column);
    }
    if ((int)local_7c == -1) break;
    if ((int)local_7c == 0) {
      if (local_7c._4_4_ != -2) {
        Token::Token(&local_f0,local_7c._4_4_,(string *)&column,c._M_current._4_4_,prevLine,
                     (int)c._M_current,prevColumn);
        std::vector<lexer::Token,_std::allocator<lexer::Token>_>::push_back
                  (__return_storage_ptr__,&local_f0);
        Token::~Token(&local_f0);
      }
      c._M_current._4_4_ = prevLine;
      c._M_current._0_4_ = prevColumn;
      std::__cxx11::string::clear();
    }
    token.field_2._12_4_ = (int)local_7c;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+=(&local_60,(long)transition.tokenId);
  }
  local_b1 = 1;
  this_01 = (LexerError *)__cxa_allocate_exception(0x10);
  pcVar2 = __gnu_cxx::
           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_60);
  common::xsnprintf_abi_cxx11_
            (&local_b0,0x40,"invalid char \"%c\" at %d:%d",(ulong)(uint)(int)*pcVar2,
             (ulong)(uint)prevLine,(ulong)(uint)prevColumn);
  LexerError::LexerError(this_01,&local_b0);
  local_b1 = 0;
  __cxa_throw(this_01,&LexerError::typeinfo,LexerError::~LexerError);
}

Assistant:

Tokens analize(std::string const& string) {
            RuleId currentState = Initial;
            Tokens tokens;
            std::string token;
            int line = 1;
            int column = 0;
            int prevLine = line;
            int prevColumn = column;
            for (std::string::const_iterator c = string.begin(); c != string.end();) {
                if (*c == '\n') {
                    ++line;
                    column = 0;
                } else {
                    ++column;
                }
                Transition transition = lexerStateMachine.
                        at(static_cast<size_t>(currentState)).
                        at(static_cast<size_t>(*c));

                if (transition.putChar)
                    token.push_back(*c);

                if (transition.ruleId == InvalidRule)
                    throw LexerError(common::xsnprintf(64, "invalid char \"%c\" at %d:%d", *c, line, column));
                else {
                    if (transition.ruleId == Initial) {
                        if (transition.tokenId != Skip)
                            tokens.push_back(Token(static_cast<TokenId>(transition.tokenId), token, prevLine, line, prevColumn, column));
                        prevLine = line;
                        prevColumn = column;
                        token.clear();
                    }
                    currentState = transition.ruleId;
                }
                c += transition.increment;
            }
            return tokens;
        }